

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestTestHandler.cxx
# Opt level: O3

void __thiscall cmCTestTestHandler::SetTestsToRunInformation(cmCTestTestHandler *this,char *in)

{
  char *pcVar1;
  bool bVar2;
  size_t sVar3;
  unsigned_long uVar4;
  char *__s;
  ifstream fin;
  string local_258;
  long local_238;
  long local_230;
  
  if (in != (char *)0x0) {
    pcVar1 = (char *)(this->TestsToRunString)._M_string_length;
    strlen(in);
    std::__cxx11::string::_M_replace((ulong)&this->TestsToRunString,0,pcVar1,(ulong)in);
    bVar2 = cmsys::SystemTools::FileExists(in);
    if (bVar2) {
      std::ifstream::ifstream(&local_238,in,_S_in);
      local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
      sVar3 = strlen(in);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,in,in + sVar3);
      uVar4 = cmsys::SystemTools::FileLength(&local_258);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_258._M_dataplus._M_p != &local_258.field_2) {
        operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
      }
      __s = (char *)operator_new__(uVar4 + 1);
      std::ios::widen((char)&local_238 + (char)*(undefined8 *)(local_238 + -0x18));
      std::istream::getline((char *)&local_238,(long)__s,(char)uVar4);
      __s[local_230] = '\0';
      pcVar1 = (char *)(this->TestsToRunString)._M_string_length;
      strlen(__s);
      std::__cxx11::string::_M_replace((ulong)&this->TestsToRunString,0,pcVar1,(ulong)__s);
      operator_delete__(__s);
      std::ifstream::~ifstream(&local_238);
    }
  }
  return;
}

Assistant:

void cmCTestTestHandler::SetTestsToRunInformation(const char* in)
{
  if ( !in )
    {
    return;
    }
  this->TestsToRunString = in;
  // if the argument is a file, then read it and use the contents as the
  // string
  if(cmSystemTools::FileExists(in))
    {
    cmsys::ifstream fin(in);
    unsigned long filelen = cmSystemTools::FileLength(in);
    char* buff = new char[filelen+1];
    fin.getline(buff, filelen);
    buff[fin.gcount()] = 0;
    this->TestsToRunString = buff;
    delete [] buff;
    }
}